

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O0

next_result * __thiscall
QStringTokenizerBase<QLatin1String,_QChar>::next
          (QStringTokenizerBase<QLatin1String,_QChar> *this,tokenizer_state state)

{
  bool bVar1;
  Int IVar2;
  char *pcVar3;
  qsizetype qVar4;
  QLatin1String *in_RSI;
  next_result *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar5;
  qsizetype ns;
  QLatin1String result;
  SplitBehaviorFlags in_stack_ffffffffffffff7c;
  next_result *pos;
  QLatin1String *this_00;
  QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4> local_4c;
  QLatin1StringView local_48;
  QChar in_stack_ffffffffffffffce;
  qsizetype local_30;
  char *local_28;
  QLatin1String local_20;
  undefined2 local_a;
  long local_8;
  
  this_00 = (QLatin1String *)&stack0x00000008;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pos = in_RDI;
  do {
    if ((long)this_00->m_data < 0) {
      QLatin1String::QLatin1String(&in_RDI->value);
      in_RDI->ok = false;
      (in_RDI->state).start = this_00->m_size;
      (in_RDI->state).end = (qsizetype)this_00->m_data;
      (in_RDI->state).extra = this_00[1].m_size;
      goto LAB_0011885a;
    }
    local_a = *(undefined2 *)&in_RSI[1].m_data;
    pcVar3 = (char *)QLatin1String::indexOf
                               (in_RSI,in_stack_ffffffffffffffce,(qsizetype)this_00,
                                (CaseSensitivity)((ulong)pos >> 0x20));
    this_00->m_data = pcVar3;
    local_20.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_20.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QLatin1String::QLatin1String(&local_20);
    if ((long)this_00->m_data < 0) {
      local_48 = QLatin1String::sliced(this_00,(qsizetype)pos);
      local_20.m_size = local_48.m_size;
      local_20.m_data = local_48.m_data;
    }
    else {
      QVar5 = QLatin1String::sliced(this_00,(qsizetype)pos,(qsizetype)in_RDI);
      local_30 = QVar5.m_size;
      local_20.m_size = local_30;
      local_28 = QVar5.m_data;
      local_20.m_data = local_28;
      in_stack_ffffffffffffffce.ucs = *(char16_t *)&in_RSI[1].m_data;
      qVar4 = QtPrivate::Tok::tokenSize(in_stack_ffffffffffffffce);
      this_00->m_size = (qsizetype)(this_00->m_data + qVar4);
      this_00[1].m_size = (long)(int)(uint)(qVar4 == 0);
    }
    local_4c.super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
         (QFlagsStorage<Qt::SplitBehaviorFlags>)
         QFlags<Qt::SplitBehaviorFlags>::operator&
                   ((QFlags<Qt::SplitBehaviorFlags> *)in_RDI,in_stack_ffffffffffffff7c);
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_4c);
    in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c & 0xffffff;
    if (IVar2 != 0) {
      bVar1 = QLatin1String::isEmpty((QLatin1String *)0x118811);
      in_stack_ffffffffffffff7c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff7c);
    }
  } while ((char)(in_stack_ffffffffffffff7c >> 0x18) != '\0');
  (in_RDI->value).m_size = local_20.m_size;
  (in_RDI->value).m_data = local_20.m_data;
  in_RDI->ok = true;
  (in_RDI->state).start = this_00->m_size;
  (in_RDI->state).end = (qsizetype)this_00->m_data;
  (in_RDI->state).extra = this_00[1].m_size;
LAB_0011885a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pos;
  }
  __stack_chk_fail();
}

Assistant:

auto QStringTokenizerBase<Haystack, Needle>::next(tokenizer_state state) const noexcept -> next_result
{
    while (true) {
        if (state.end < 0) {
            // already at end:
            return {{}, false, state};
        }
        state.end = m_haystack.indexOf(m_needle, state.start + state.extra, m_cs);
        Haystack result;
        if (state.end >= 0) {
            // token separator found => return intermediate element:
            result = m_haystack.sliced(state.start, state.end - state.start);
            const auto ns = QtPrivate::Tok::tokenSize(m_needle);
            state.start = state.end + ns;
            state.extra = (ns == 0 ? 1 : 0);
        } else {
            // token separator not found => return final element:
            result = m_haystack.sliced(state.start);
        }
        if ((m_sb & Qt::SkipEmptyParts) && result.isEmpty())
            continue;
        return {result, true, state};
    }
}